

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

void duckdb_je_tcaches_destroy(tsd_t *tsd,uint ind)

{
  anon_union_8_2_150e8edc_for_tcaches_s_0 *paVar1;
  int iVar2;
  anon_union_8_2_150e8edc_for_tcaches_s_0 tcache;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&tcaches_mtx.field_0 + 0x48));
  if (iVar2 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&tcaches_mtx);
  }
  tcaches_mtx.field_0.field_0.prof_data.n_lock_ops =
       tcaches_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(tcaches_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    tcaches_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(tcaches_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    tcaches_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  paVar1 = &duckdb_je_tcaches[ind].field_0;
  tcache.next = *(tcaches_t **)paVar1;
  if (tcache == (tcache_t *)0x0) {
    tcache.tcache = (tcache_t *)0x0;
  }
  else {
    *paVar1 = (anon_union_8_2_150e8edc_for_tcaches_s_0)0x0;
    if (tcache == (tcache_t *)&DAT_00000001) {
      tcache.tcache = (tcache_t *)0x0;
    }
  }
  paVar1->next = tcaches_avail;
  tcaches_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  tcaches_avail = (tcaches_t *)paVar1;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&tcaches_mtx.field_0 + 0x48));
  if (tcache.tcache == (tcache_t *)0x0) {
    return;
  }
  tcache_destroy(tsd,tcache.tcache,false);
  return;
}

Assistant:

void
tcaches_destroy(tsd_t *tsd, unsigned ind) {
	malloc_mutex_lock(tsd_tsdn(tsd), &tcaches_mtx);
	tcaches_t *elm = &tcaches[ind];
	tcache_t *tcache = tcaches_elm_remove(tsd, elm, false);
	elm->next = tcaches_avail;
	tcaches_avail = elm;
	malloc_mutex_unlock(tsd_tsdn(tsd), &tcaches_mtx);
	if (tcache != NULL) {
		tcache_destroy(tsd, tcache, false);
	}
}